

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::Storage::uninstallCustomFormatSpecifier(Storage *this,char *formatSpecifier)

{
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  __first;
  const_iterator __position;
  bool bVar1;
  int iVar2;
  pointer this_00;
  char *in_RSI;
  Storage *in_RDI;
  iterator it;
  ScopedLock scopedLock;
  NoMutex *in_stack_ffffffffffffff58;
  __normal_iterator<const_el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  *in_stack_ffffffffffffff60;
  char **in_stack_ffffffffffffff68;
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar3;
  __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
  local_28;
  NoScopedLock<el::base::threading::internal::NoMutex> local_20;
  char *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  customFormatSpecifiersLock(in_RDI);
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::begin
            ((vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_> *)
             in_stack_ffffffffffffff58);
  utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::end
            ((vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_> *)
             in_stack_ffffffffffffff58);
  __first._M_current._7_1_ = in_stack_ffffffffffffff7f;
  __first._M_current._0_7_ = in_stack_ffffffffffffff78;
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<el::CustomFormatSpecifier*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>,char_const*>
                       (__first,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::end
            ((vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_> *)
             in_stack_ffffffffffffff58);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                      *)in_stack_ffffffffffffff60,
                     (__normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                      *)in_stack_ffffffffffffff58);
  uVar3 = false;
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
              ::operator->(&local_28);
    in_stack_ffffffffffffff70._M_current =
         (CustomFormatSpecifier *)CustomFormatSpecifier::formatSpecifier(this_00);
    iVar2 = strcmp(local_18,(char *)in_stack_ffffffffffffff70._M_current);
    uVar3 = iVar2 == 0;
  }
  bVar1 = (bool)uVar3 != false;
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<el::CustomFormatSpecifier_const*,std::vector<el::CustomFormatSpecifier,std::allocator<el::CustomFormatSpecifier>>>
    ::__normal_iterator<el::CustomFormatSpecifier*>
              (in_stack_ffffffffffffff60,
               (__normal_iterator<el::CustomFormatSpecifier_*,_std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>_>
                *)&in_RDI->m_customFormatSpecifiers);
    __position._M_current._7_1_ = uVar3;
    __position._M_current._0_7_ = in_stack_ffffffffffffff78;
    utils::std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::erase
              ((vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_> *)
               in_stack_ffffffffffffff70._M_current,__position);
  }
  local_1 = bVar1;
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_20);
  return (bool)(local_1 & 1);
}

Assistant:

bool Storage::uninstallCustomFormatSpecifier(const char* formatSpecifier) {
  base::threading::ScopedLock scopedLock(customFormatSpecifiersLock());
  std::vector<CustomFormatSpecifier>::iterator it = std::find(m_customFormatSpecifiers.begin(),
      m_customFormatSpecifiers.end(), formatSpecifier);
  if (it != m_customFormatSpecifiers.end() && strcmp(formatSpecifier, it->formatSpecifier()) == 0) {
    m_customFormatSpecifiers.erase(it);
    return true;
  }
  return false;
}